

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O0

void __thiscall
wasm::FunctionValidator::visitCallIndirect(FunctionValidator *this,CallIndirect *curr)

{
  bool bVar1;
  Module *this_00;
  Table *pTVar2;
  Table *table;
  Type local_28;
  Type local_20;
  CallIndirect *local_18;
  CallIndirect *curr_local;
  FunctionValidator *this_local;
  
  local_18 = curr;
  curr_local = (CallIndirect *)this;
  validateReturnCall<wasm::CallIndirect>(this,curr);
  local_20.id = (local_18->target->type).id;
  wasm::Type::Type(&local_28,i32);
  shouldBeEqualOrFirstIsUnreachable<wasm::CallIndirect*,wasm::Type>
            (this,local_20,local_28,local_18,"indirect call target must be an i32");
  table._4_4_ = 1;
  bVar1 = wasm::Type::operator!=(&local_18->target->type,(BasicType *)((long)&table + 4));
  if (bVar1) {
    this_00 = Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::
              getModule(&(this->
                         super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                         ).
                         super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                         .
                         super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                       );
    pTVar2 = Module::getTableOrNull(this_00,(Name)(local_18->table).super_IString.str);
    shouldBeTrue<wasm::CallIndirect*>
              (this,pTVar2 != (Table *)0x0,local_18,"call-indirect table must exist");
    if (pTVar2 != (Table *)0x0) {
      bVar1 = wasm::Type::isFunction(&pTVar2->type);
      shouldBeTrue<wasm::CallIndirect*>
                (this,bVar1,local_18,"call-indirect table must be of function type.");
    }
  }
  validateCallParamsAndResult<wasm::CallIndirect>(this,local_18,(HeapType)(local_18->heapType).id);
  return;
}

Assistant:

void FunctionValidator::visitCallIndirect(CallIndirect* curr) {
  validateReturnCall(curr);
  shouldBeEqualOrFirstIsUnreachable(curr->target->type,
                                    Type(Type::i32),
                                    curr,
                                    "indirect call target must be an i32");

  if (curr->target->type != Type::unreachable) {
    auto* table = getModule()->getTableOrNull(curr->table);
    shouldBeTrue(!!table, curr, "call-indirect table must exist");
    if (table) {
      shouldBeTrue(table->type.isFunction(),
                   curr,
                   "call-indirect table must be of function type.");
    }
  }

  validateCallParamsAndResult(curr, curr->heapType);
}